

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::setFrameBuffer(InputFile *this,FrameBuffer *frameBuffer)

{
  PixelType PVar1;
  double *pdVar2;
  double fv;
  double fv_00;
  double fv_01;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *name;
  const_iterator slice;
  char *__s1;
  char *__s2;
  Box2i *pBVar7;
  undefined8 *puVar8;
  Slice *pSVar9;
  void *pvVar10;
  ArgExc *this_00;
  long in_RDI;
  FrameBuffer *in_stack_00000208;
  Slice s;
  ConstIterator k;
  uint tileRowSize;
  Box2i *dataWindow;
  ConstIterator j;
  ConstIterator i;
  FrameBuffer *oldFrameBuffer;
  Lock lock;
  FrameBuffer *in_stack_000002d8;
  ScanLineInputFile *in_stack_000002e0;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  uint in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  Lock *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  FrameBuffer *in_stack_fffffffffffffdb8;
  CompositeDeepScanLine *in_stack_fffffffffffffdc0;
  bool local_1da;
  bool local_192;
  Slice local_170;
  int in_stack_fffffffffffffefc;
  TiledInputFile *in_stack_ffffffffffffff00;
  FrameBuffer *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 100) & 1) == 0) {
    if (*(long *)(*(long *)(in_RDI + 8) + 200) == 0) {
      ScanLineInputFile::setFrameBuffer(in_stack_000002e0,in_stack_000002d8);
      FrameBuffer::operator=
                ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (FrameBuffer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    }
    else {
      CompositeDeepScanLine::setFrameBuffer(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    }
  }
  else {
    IlmThread_2_5::Lock::Lock
              (in_stack_fffffffffffffd40,
               (Mutex *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               SUB41(in_stack_fffffffffffffd34 >> 0x18,0));
    name = (char *)(*(long *)(in_RDI + 8) + 0x90);
    slice._M_node =
         (_Base_ptr)
         FrameBuffer::begin((FrameBuffer *)
                            CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    FrameBuffer::begin((FrameBuffer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
    ;
    while( true ) {
      FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
      bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                  (ConstIterator *)
                                  CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      local_192 = false;
      if (bVar3) {
        FrameBuffer::end((FrameBuffer *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        local_192 = Imf_2_5::operator!=((ConstIterator *)
                                        CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30
                                                ),
                                        (ConstIterator *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
      }
      if (local_192 == false) break;
      __s1 = FrameBuffer::ConstIterator::name((ConstIterator *)0xa4b509);
      __s2 = FrameBuffer::ConstIterator::name((ConstIterator *)0xa4b520);
      iVar4 = strcmp(__s1,__s2);
      if (iVar4 != 0) break;
      pSVar9 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa4b551);
      PVar1 = pSVar9->type;
      pSVar9 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa4b579);
      if (PVar1 != pSVar9->type) break;
      FrameBuffer::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      FrameBuffer::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    }
    FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_1da = true;
    if (!bVar3) {
      FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
      local_1da = Imf_2_5::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
    }
    if (local_1da != false) {
      Data::deleteCachedBuffer
                ((Data *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0xd0) = 0xffffffff;
      pBVar7 = Header::dataWindow((Header *)0xa4b6d8);
      puVar8 = (undefined8 *)operator_new(0x30);
      puVar8[4] = 0;
      puVar8[5] = 0;
      puVar8[2] = 0;
      puVar8[3] = 0;
      *puVar8 = 0;
      puVar8[1] = 0;
      FrameBuffer::FrameBuffer((FrameBuffer *)0xa4b721);
      *(undefined8 **)(*(long *)(in_RDI + 8) + 0xc0) = puVar8;
      *(int *)(*(long *)(in_RDI + 8) + 0xd4) = (pBVar7->min).x;
      TiledInputFile::tileYSize(*(TiledInputFile **)(*(long *)(in_RDI + 8) + 0x68));
      uVar5 = uiMult<unsigned_int>(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30);
      FrameBuffer::begin((FrameBuffer *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      while( true ) {
        FrameBuffer::end((FrameBuffer *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        if (!bVar3) break;
        pSVar9 = FrameBuffer::ConstIterator::slice((ConstIterator *)0xa4b831);
        PVar1 = pSVar9->type;
        pdVar2 = &pSVar9->fillValue;
        fv_01 = *pdVar2;
        fv_00 = *pdVar2;
        fv = *pdVar2;
        if (PVar1 == UINT) {
          FrameBuffer::ConstIterator::name((ConstIterator *)0xa4b8d5);
          pvVar10 = operator_new__((ulong)uVar5 << 2);
          iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0xd4);
          iVar6 = TiledInputFile::levelWidth(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          in_stack_fffffffffffffd30 = 0;
          in_stack_fffffffffffffd28 = 1;
          Slice::Slice((Slice *)&stack0xffffffffffffff00,UINT,
                       (char *)((long)pvVar10 + (long)iVar4 * -4),4,(long)iVar6 << 2,1,1,fv,false,
                       true);
          FrameBuffer::insert(in_stack_ffffffffffffffe0,name,(Slice *)slice._M_node);
        }
        else if (PVar1 == HALF) {
          FrameBuffer::ConstIterator::name((ConstIterator *)0xa4b9ce);
          pvVar10 = operator_new__((ulong)uVar5 * 2);
          iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0xd4);
          iVar6 = TiledInputFile::levelWidth(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          in_stack_fffffffffffffd30 = 0;
          in_stack_fffffffffffffd28 = 1;
          Slice::Slice((Slice *)&stack0xfffffffffffffec8,HALF,
                       (char *)((long)pvVar10 + (long)iVar4 * -2),2,(long)iVar6 * 2,1,1,fv_00,false,
                       true);
          FrameBuffer::insert(in_stack_ffffffffffffffe0,name,(Slice *)slice._M_node);
        }
        else {
          if (PVar1 != FLOAT) {
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
            __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          FrameBuffer::ConstIterator::name((ConstIterator *)0xa4bab0);
          pvVar10 = operator_new__((ulong)uVar5 << 2);
          iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0xd4);
          iVar6 = TiledInputFile::levelWidth(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          in_stack_fffffffffffffd30 = 0;
          in_stack_fffffffffffffd28 = 1;
          Slice::Slice(&local_170,FLOAT,(char *)((long)pvVar10 + (long)iVar4 * -4),4,
                       (long)iVar6 << 2,1,1,fv_01,false,true);
          FrameBuffer::insert(in_stack_ffffffffffffffe0,name,(Slice *)slice._M_node);
        }
        FrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      }
      TiledInputFile::setFrameBuffer((TiledInputFile *)s._0_8_,in_stack_00000208);
    }
    FrameBuffer::operator=
              ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  }
  return;
}

Assistant:

void
InputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    if (_data->isTiled)
    {
	Lock lock (*_data);

	//
        // We must invalidate the cached buffer if the new frame
	// buffer has a different set of channels than the old
	// frame buffer, or if the type of a channel has changed.
	//

	const FrameBuffer &oldFrameBuffer = _data->tFileBuffer;

	FrameBuffer::ConstIterator i = oldFrameBuffer.begin();
	FrameBuffer::ConstIterator j = frameBuffer.begin();

	while (i != oldFrameBuffer.end() && j != frameBuffer.end())
	{
	    if (strcmp (i.name(), j.name()) || i.slice().type != j.slice().type)
		break;

	    ++i;
	    ++j;
	}

	if (i != oldFrameBuffer.end() || j != frameBuffer.end())
        {
	    //
	    // Invalidate the cached buffer.
	    //

            _data->deleteCachedBuffer ();
	    _data->cachedTileY = -1;

	    //
	    // Create new a cached frame buffer.  It can hold a single
	    // row of tiles.  The cached buffer can be reused for each
	    // row of tiles because we set the yTileCoords parameter of
	    // each Slice to true.
	    //

	    const Box2i &dataWindow = _data->header.dataWindow();
	    _data->cachedBuffer = new FrameBuffer();
	    _data->offset = dataWindow.min.x;
	    
	    unsigned int tileRowSize =
                uiMult(dataWindow.max.x - dataWindow.min.x + 1U,
                       _data->tFile->tileYSize());

	    for (FrameBuffer::ConstIterator k = frameBuffer.begin();
		 k != frameBuffer.end();
		 ++k)
	    {
		Slice s = k.slice();

		switch (s.type)
		{
		  case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		    _data->cachedBuffer->insert
			(k.name(),
			 Slice (UINT,
				(char *)(new unsigned int[tileRowSize] - 
					_data->offset),
				sizeof (unsigned int),
				sizeof (unsigned int) *
				    _data->tFile->levelWidth(0),
				1, 1,
				s.fillValue,
				false, true));
		    break;

		  case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		    _data->cachedBuffer->insert
			(k.name(),
			 Slice (HALF,
				(char *)(new half[tileRowSize] - 
					_data->offset),
				sizeof (half),
				sizeof (half) *
				    _data->tFile->levelWidth(0),
				1, 1,
				s.fillValue,
				false, true));
		    break;

		  case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		    _data->cachedBuffer->insert
			(k.name(),
			 Slice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
				(char *)(new float[tileRowSize] - 
					_data->offset),
				sizeof(float),
				sizeof(float) *
				    _data->tFile->levelWidth(0),
				1, 1,
				s.fillValue,
				false, true));
		    break;

		  default:

		    throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
		}
	    }

	    _data->tFile->setFrameBuffer (*_data->cachedBuffer);
        }

	_data->tFileBuffer = frameBuffer;
    }
    else if(_data->compositor)
    {
        _data->compositor->setFrameBuffer(frameBuffer);
    }else {
        _data->sFile->setFrameBuffer(frameBuffer);
        _data->tFileBuffer = frameBuffer;
    }
}